

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int fftsad(fitsfile *mfptr,HDUtracker *HDU,int *newPosition,char *newFileName)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  char *__dest_00;
  ulong uVar4;
  ulong uVar5;
  int local_864;
  int *local_860;
  char *local_858;
  int hdunum;
  char filename2 [1025];
  char filename1 [1025];
  
  local_864 = 0;
  local_860 = newPosition;
  local_858 = newFileName;
  ffghdn(mfptr,&hdunum);
  local_864 = ffflnm(mfptr,filename1,&local_864);
  iVar2 = ffrtnm(filename1,filename2,&local_864);
  uVar1 = HDU->nHDU;
  uVar4 = 0;
  uVar5 = 0;
  local_864 = iVar2;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    if (uVar5 == uVar4) {
LAB_001adf77:
      if ((uint)uVar5 == uVar1) {
        iVar3 = 0x159;
        if (uVar1 != 1000) {
          __dest = (char *)malloc(0x401);
          HDU->filename[uVar1] = __dest;
          iVar3 = 0x71;
          if (__dest != (char *)0x0) {
            __dest_00 = (char *)malloc(0x401);
            HDU->newFilename[uVar1] = __dest_00;
            if (__dest_00 == (char *)0x0) {
              free(__dest);
            }
            else {
              HDU->position[uVar1] = hdunum;
              HDU->newPosition[uVar1] = hdunum;
              strcpy(__dest,filename2);
              strcpy(__dest_00,filename2);
              HDU->nHDU = uVar1 + 1;
              iVar3 = iVar2;
            }
          }
        }
      }
      else {
        local_864 = 0x15a;
        if (local_860 != (int *)0x0) {
          *local_860 = HDU->newPosition[uVar5];
        }
        iVar3 = 0x15a;
        if (local_858 != (char *)0x0) {
          strcpy(local_858,HDU->newFilename[uVar5]);
        }
      }
      return iVar3;
    }
    if (HDU->position[uVar4] == hdunum) {
      iVar3 = strcmp(HDU->filename[uVar4],filename2);
      if (iVar3 == 0) {
        uVar5 = uVar4 & 0xffffffff;
        goto LAB_001adf77;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int fftsad(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int        *newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  add an HDU to the HDUtracker struct pointed to by HDU. The HDU is only 
  added if it does not already reside in the HDUtracker. If it already
  resides in the HDUtracker then the new HDU postion and file name are
  returned in  newPosition and newFileName (if != NULL)
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];

  do
    {
      /* retrieve the HDU's position within the FITS file */

      fits_get_hdu_num(mfptr,&hdunum);
      
      /* retrieve the HDU's file name */
      
      status = fits_file_name(mfptr,filename1,&status);
      
      /* parse the file name and construct the "standard" URL for it */
      
      status = ffrtnm(filename1,filename2,&status);
      
      /* 
	 examine all the existing HDUs in the HDUtracker an see if this HDU
	 has already been registered
      */

      for(i = 0; 
       i < HDU->nHDU &&  !(HDU->position[i] == hdunum 
			   && strcmp(HDU->filename[i],filename2) == 0);
	  ++i);

      if(i != HDU->nHDU) 
	{
	  status = HDU_ALREADY_TRACKED;
	  if(newPosition != NULL) *newPosition = HDU->newPosition[i];
	  if(newFileName != NULL) strcpy(newFileName,HDU->newFilename[i]);
	  continue;
	}

      if(HDU->nHDU == MAX_HDU_TRACKER) 
	{
	  status = TOO_MANY_HDUS_TRACKED;
	  continue;
	}

      HDU->filename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->filename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  continue;
	}

      HDU->newFilename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->newFilename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  free(HDU->filename[i]);
	  continue;
	}

      HDU->position[i]    = hdunum;
      HDU->newPosition[i] = hdunum;

      strcpy(HDU->filename[i],filename2);
      strcpy(HDU->newFilename[i],filename2);
 
       ++(HDU->nHDU);

    }while(0);

  return(status);
}